

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathCompExprPtr xmlXPathNewCompExpr(void)

{
  xmlXPathStepOp *pxVar1;
  xmlXPathCompExprPtr cur;
  
  cur = (xmlXPathCompExprPtr)(*xmlMalloc)(0x30);
  if (cur == (xmlXPathCompExprPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"allocating component\n");
    cur = (xmlXPathCompExprPtr)0x0;
  }
  else {
    memset(cur,0,0x30);
    cur->maxStep = 10;
    cur->nbStep = 0;
    pxVar1 = (xmlXPathStepOp *)(*xmlMalloc)((long)cur->maxStep * 0x38);
    cur->steps = pxVar1;
    if (cur->steps == (xmlXPathStepOp *)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"allocating steps\n");
      (*xmlFree)(cur);
      cur = (xmlXPathCompExprPtr)0x0;
    }
    else {
      memset(cur->steps,0,(long)cur->maxStep * 0x38);
      cur->last = -1;
    }
  }
  return cur;
}

Assistant:

static xmlXPathCompExprPtr
xmlXPathNewCompExpr(void) {
    xmlXPathCompExprPtr cur;

    cur = (xmlXPathCompExprPtr) xmlMalloc(sizeof(xmlXPathCompExpr));
    if (cur == NULL) {
        xmlXPathErrMemory(NULL, "allocating component\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlXPathCompExpr));
    cur->maxStep = 10;
    cur->nbStep = 0;
    cur->steps = (xmlXPathStepOp *) xmlMalloc(cur->maxStep *
	                                   sizeof(xmlXPathStepOp));
    if (cur->steps == NULL) {
        xmlXPathErrMemory(NULL, "allocating steps\n");
	xmlFree(cur);
	return(NULL);
    }
    memset(cur->steps, 0, cur->maxStep * sizeof(xmlXPathStepOp));
    cur->last = -1;
#ifdef DEBUG_EVAL_COUNTS
    cur->nb = 0;
#endif
    return(cur);
}